

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_8::DiskHandle::tryTransfer
          (DiskHandle *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode,Directory *self)

{
  int fromDirFd;
  PathPtr toPath_00;
  PathPtr path;
  DiskHandle *pDVar1;
  String *pSVar2;
  bool bVar3;
  WriteMode WVar4;
  size_t sVar5;
  NullableValue<int> *pNVar6;
  int *piVar7;
  PathPtr PVar8;
  Fault local_150;
  Fault f_2;
  String local_118;
  ArrayPtr<const_char> local_100;
  String local_f0;
  ArrayPtr<const_char> local_d8;
  int local_c4;
  int error;
  Fault f_1;
  NullableValue<int> local_ac;
  NullableValue<int> fromFd_1;
  Function<int_(kj::StringPtr)> local_88;
  String *local_78;
  String *pSStack_70;
  Maybe<int> local_64;
  NullableValue<int> local_5c;
  NullableValue<int> fromFd;
  Fault local_48;
  Fault f;
  TransferMode mode_local;
  Directory *fromDirectory_local;
  WriteMode toMode_local;
  DiskHandle *this_local;
  PathPtr toPath_local;
  
  toPath_local.parts.ptr = (String *)toPath.parts.size_;
  this_local = (DiskHandle *)toPath.parts.ptr;
  f.exception._4_4_ = mode;
  sVar5 = PathPtr::size((PathPtr *)&this_local);
  if (sVar5 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x586,FAILED,"toPath.size() > 0","\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    toPath_local.parts.size_._7_1_ = 0;
    kj::_::Debug::Fault::~Fault(&local_48);
    goto LAB_0051d650;
  }
  if (f.exception._4_4_ == LINK) {
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)();
    pNVar6 = kj::_::readMaybe<int>(&local_64);
    kj::_::NullableValue<int>::NullableValue(&local_5c,pNVar6);
    Maybe<int>::~Maybe(&local_64);
    piVar7 = kj::_::NullableValue::operator_cast_to_int_((NullableValue *)&local_5c);
    if (piVar7 != (int *)0x0) {
      local_78 = (String *)this_local;
      pSStack_70 = toPath_local.parts.ptr;
      unique0x00004780 = &local_5c;
      Function<int(kj::StringPtr)>::
      Function<kj::(anonymous_namespace)::DiskHandle::tryTransfer(kj::PathPtr,kj::WriteMode,kj::Directory_const&,kj::PathPtr,kj::TransferMode,kj::Directory_const&)const::_lambda(kj::StringPtr)_1_>
                ((Function<int(kj::StringPtr)> *)&local_88,(Type *)&fromFd_1.field_1);
      path.parts.size_ = (size_t)pSStack_70;
      path.parts.ptr = local_78;
      toPath_local.parts.size_._7_1_ = tryReplaceNode(this,path,toMode,&local_88);
      Function<int_(kj::StringPtr)>::~Function(&local_88);
    }
    fromFd_1._1_3_ = 0;
    fromFd_1.isSet = piVar7 != (int *)0x0;
    kj::_::NullableValue<int>::~NullableValue(&local_5c);
joined_r0x0051d5c2:
    if (fromFd_1._0_4_ != 0) goto LAB_0051d650;
  }
  else if (f.exception._4_4_ == MOVE) {
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)();
    pNVar6 = kj::_::readMaybe<int>((Maybe<int> *)((long)&f_1.exception + 4));
    kj::_::NullableValue<int>::NullableValue(&local_ac,pNVar6);
    Maybe<int>::~Maybe((Maybe<int> *)((long)&f_1.exception + 4));
    piVar7 = kj::_::NullableValue::operator_cast_to_int_((NullableValue *)&local_ac);
    if (piVar7 == (int *)0x0) {
LAB_0051d5a4:
      fromFd_1.isSet = false;
      fromFd_1._1_3_ = 0;
    }
    else {
      if (f.exception._4_4_ != MOVE) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&stack0xffffffffffffff40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x591,FAILED,"mode == TransferMode::MOVE","");
        kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff40);
      }
      local_c4 = 0;
      PathPtr::toString(&local_f0,(PathPtr *)&this_local,false);
      StringPtr::StringPtr((StringPtr *)&local_d8,&local_f0);
      piVar7 = kj::_::NullableValue<int>::operator*(&local_ac);
      fromDirFd = *piVar7;
      PathPtr::toString(&local_118,&fromPath,false);
      StringPtr::StringPtr((StringPtr *)&local_100,&local_118);
      bVar3 = tryCommitReplacement
                        (this,(StringPtr)local_d8,fromDirFd,(StringPtr)local_100,toMode,&local_c4);
      String::~String(&local_118);
      String::~String(&local_f0);
      if (bVar3) {
        toPath_local.parts.size_._7_1_ = 1;
        fromFd_1.isSet = true;
        fromFd_1._1_3_ = 0;
      }
      else if (local_c4 == 0) {
        toPath_local.parts.size_._7_1_ = 0;
        fromFd_1.isSet = true;
        fromFd_1._1_3_ = 0;
      }
      else if (local_c4 == 2) {
        bVar3 = has<kj::WriteMode,void>(toMode,CREATE);
        if (((bVar3) && (bVar3 = has<kj::WriteMode,void>(toMode,CREATE_PARENT), bVar3)) &&
           (sVar5 = PathPtr::size((PathPtr *)&this_local), sVar5 != 0)) {
          PVar8 = PathPtr::parent((PathPtr *)&this_local);
          WVar4 = operator|(CREATE,MODIFY);
          WVar4 = operator|(WVar4,CREATE_PARENT);
          bVar3 = tryMkdir(this,PVar8,WVar4,true);
          pSVar2 = toPath_local.parts.ptr;
          pDVar1 = this_local;
          if (bVar3) {
            WVar4 = operator-(toMode,CREATE_PARENT);
            f_2.exception = (Exception *)fromPath.parts.ptr;
            PVar8.parts.size_ = (size_t)pSVar2;
            PVar8.parts.ptr = (String *)pDVar1;
            toPath_local.parts.size_._7_1_ =
                 tryTransfer(this,PVar8,WVar4,fromDirectory,fromPath,f.exception._4_4_,self);
            fromFd_1.isSet = true;
            fromFd_1._1_3_ = 0;
            goto LAB_0051d5ae;
          }
        }
        toPath_local.parts.size_._7_1_ = 0;
        fromFd_1.isSet = true;
        fromFd_1._1_3_ = 0;
      }
      else {
        if (local_c4 == 0x12) goto LAB_0051d5a4;
        kj::_::Debug::Fault::Fault<int,kj::PathPtr&,kj::PathPtr&>
                  (&local_150,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x5ad,local_c4,"rename(fromPath, toPath)","fromPath, toPath",&fromPath,
                   (PathPtr *)&this_local);
        toPath_local.parts.size_._7_1_ = 0;
        fromFd_1.isSet = true;
        fromFd_1._1_3_ = 0;
        kj::_::Debug::Fault::~Fault(&local_150);
      }
    }
LAB_0051d5ae:
    kj::_::NullableValue<int>::~NullableValue(&local_ac);
    goto joined_r0x0051d5c2;
  }
  toPath_00.parts.size_ = (size_t)toPath_local.parts.ptr;
  toPath_00.parts.ptr = (String *)this_local;
  toPath_local.parts.size_._7_1_ =
       Directory::tryTransfer(self,toPath_00,toMode,fromDirectory,fromPath,f.exception._4_4_);
LAB_0051d650:
  return (bool)(toPath_local.parts.size_._7_1_ & 1);
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode, const Directory& self) const {
    KJ_REQUIRE(toPath.size() > 0, "can't replace self") { return false; }

    if (mode == TransferMode::LINK) {
      KJ_IF_MAYBE(fromFd, fromDirectory.getFd()) {
        // Other is a disk directory, so we can hopefully do an efficient move/link.
        return tryReplaceNode(toPath, toMode, [&](StringPtr candidatePath) {
          return linkat(*fromFd, fromPath.toString().cStr(), fd, candidatePath.cStr(), 0);
        });
      };
    } else if (mode == TransferMode::MOVE) {
      KJ_IF_MAYBE(fromFd, fromDirectory.getFd()) {
        KJ_ASSERT(mode == TransferMode::MOVE);

        int error = 0;
        if (tryCommitReplacement(toPath.toString(), *fromFd, fromPath.toString(), toMode,
                                 &error)) {
          return true;
        } else switch (error) {
          case 0:
            // Plain old WriteMode precondition failure.
            return false;
          case EXDEV:
            // Can't move between devices. Fall back to default implementation, which does
            // copy/delete.
            break;
          case ENOENT:
            // Either the destination directory doesn't exist or the source path doesn't exist.
            // Unfortunately we don't really know. If CREATE_PARENT was provided, try creating
            // the parent directory. Otherwise, we don't actually need to distinguish between
            // these two errors; just return false.
            if (has(toMode, WriteMode::CREATE) && has(toMode, WriteMode::CREATE_PARENT) &&
                toPath.size() > 0 && tryMkdir(toPath.parent(),
                    WriteMode::CREATE | WriteMode::MODIFY | WriteMode::CREATE_PARENT, true)) {
              // Retry, but make sure we don't try to create the parent again.
              return tryTransfer(toPath, toMode - WriteMode::CREATE_PARENT,
                                 fromDirectory, fromPath, mode, self);
            }
            return false;
          default:
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
        }
      }
    }

    // OK, we can't do anything efficient using the OS. Fall back to default implementation.
    return self.Directory::tryTransfer(toPath, toMode, fromDirectory, fromPath, mode);
  }